

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O0

int send_existing(LIBSSH2_SESSION *session,uchar *data,size_t data_len,ssize_t *ret)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  transportpacket *p;
  ssize_t length;
  ssize_t rc;
  ssize_t *ret_local;
  size_t data_len_local;
  uchar *data_local;
  LIBSSH2_SESSION *session_local;
  
  if ((session->packet).olen == 0) {
    *ret = 0;
    session_local._4_4_ = 0;
  }
  else if ((data == (session->packet).odata) && (data_len == (session->packet).olen)) {
    *ret = 1;
    sVar1 = (long)(session->packet).ototal_num - (session->packet).osent;
    iVar3 = 0x4000;
    if ((session->flag).sigpipe != 0) {
      iVar3 = 0;
    }
    sVar2 = (*session->send)(session->socket_fd,(session->packet).outbuf + (session->packet).osent,
                             sVar1,iVar3,&session->abstract);
    if (sVar2 == sVar1) {
      (session->packet).ototal_num = 0;
      (session->packet).olen = 0;
      session_local._4_4_ = 0;
    }
    else if ((long)sVar2 < 0) {
      if (sVar2 == 0xfffffffffffffff5) {
        session->socket_block_directions = session->socket_block_directions | 2;
        session_local._4_4_ = -0x25;
      }
      else {
        session_local._4_4_ = -7;
      }
    }
    else {
      (session->packet).osent = sVar2 + (session->packet).osent;
      session_local._4_4_ = 0;
      if ((long)sVar2 < (long)sVar1) {
        session_local._4_4_ = -0x25;
      }
    }
  }
  else {
    session_local._4_4_ = -0x27;
  }
  return session_local._4_4_;
}

Assistant:

static int
send_existing(LIBSSH2_SESSION *session, const unsigned char *data,
              size_t data_len, ssize_t *ret)
{
    ssize_t rc;
    ssize_t length;
    struct transportpacket *p = &session->packet;

    if(!p->olen) {
        *ret = 0;
        return LIBSSH2_ERROR_NONE;
    }

    /* send as much as possible of the existing packet */
    if((data != p->odata) || (data_len != p->olen)) {
        /* When we are about to complete the sending of a packet, it is vital
           that the caller doesn't try to send a new/different packet since
           we don't add this one up until the previous one has been sent. To
           make the caller really notice his/hers flaw, we return error for
           this case */
        return LIBSSH2_ERROR_BAD_USE;
    }

    *ret = 1;                   /* set to make our parent return */

    /* number of bytes left to send */
    length = p->ototal_num - p->osent;

    rc = LIBSSH2_SEND(session, &p->outbuf[p->osent], length,
                       LIBSSH2_SOCKET_SEND_FLAGS(session));
    if(rc < 0)
        _libssh2_debug(session, LIBSSH2_TRACE_SOCKET,
                       "Error sending %d bytes: %d", length, -rc);
    else {
        _libssh2_debug(session, LIBSSH2_TRACE_SOCKET,
                       "Sent %d/%d bytes at %p+%d", rc, length, p->outbuf,
                       p->osent);
        debugdump(session, "libssh2_transport_write send()",
                  &p->outbuf[p->osent], rc);
    }

    if(rc == length) {
        /* the remainder of the package was sent */
        p->ototal_num = 0;
        p->olen = 0;
        /* we leave *ret set so that the parent returns as we MUST return back
           a send success now, so that we don't risk sending EAGAIN later
           which then would confuse the parent function */
        return LIBSSH2_ERROR_NONE;

    }
    else if(rc < 0) {
        /* nothing was sent */
        if(rc != -EAGAIN)
            /* send failure! */
            return LIBSSH2_ERROR_SOCKET_SEND;

        session->socket_block_directions |= LIBSSH2_SESSION_BLOCK_OUTBOUND;
        return LIBSSH2_ERROR_EAGAIN;
    }

    p->osent += rc;         /* we sent away this much data */

    return rc < length ? LIBSSH2_ERROR_EAGAIN : LIBSSH2_ERROR_NONE;
}